

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O1

bool loadSceneFramebufferTexture(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  int iVar3;
  int maxSamples;
  int local_2c;
  
  GVar1 = (*glad_glIsTexture)(g_gl.textures[1]);
  if (GVar1 != '\0') {
    (*glad_glDeleteTextures)(1,g_gl.textures + 1);
  }
  GVar1 = (*glad_glIsTexture)(g_gl.textures[2]);
  if (GVar1 != '\0') {
    (*glad_glDeleteTextures)(1,g_gl.textures + 2);
  }
  (*glad_glGenTextures)(1,g_gl.textures + 2);
  (*glad_glGenTextures)(1,g_gl.textures + 1);
  if (g_framebuffer.aa - 1U < 4) {
    iVar3 = 1 << ((byte)g_framebuffer.aa & 0x1f);
    (*glad_glGetIntegerv)(0x9110,&local_2c);
    if (local_2c < iVar3) {
      fprintf(_stdout,"note: MSAA is %ix\n");
      fflush(_stdout);
      iVar3 = local_2c;
    }
    fwrite("Loading {Scene-MSAA-Z-Framebuffer-Texture}\n",0x2b,1,_stdout);
    fflush(_stdout);
    (*glad_glActiveTexture)(0x84c2);
    (*glad_glBindTexture)(0x9100,g_gl.textures[2]);
    (*glad_glTexStorage2DMultisample)
              (0x9100,iVar3,0x88f0,g_framebuffer.w,g_framebuffer.h,
               (GLboolean)g_framebuffer.msaa.fixed);
    fwrite("Loading {Scene-MSAA-RGBA-Framebuffer-Texture}\n",0x2e,1,_stdout);
    fflush(_stdout);
    (*glad_glActiveTexture)(0x84c1);
    (*glad_glBindTexture)(0x9100,g_gl.textures[1]);
    (*glad_glTexStorage2DMultisample)
              (0x9100,iVar3,0x8814,g_framebuffer.w,g_framebuffer.h,
               (GLboolean)g_framebuffer.msaa.fixed);
  }
  else if (g_framebuffer.aa == 0) {
    fwrite("Loading {Scene-Z-Framebuffer-Texture}\n",0x26,1,_stdout);
    fflush(_stdout);
    (*glad_glActiveTexture)(0x84c2);
    (*glad_glBindTexture)(0xde1,g_gl.textures[2]);
    (*glad_glTexStorage2D)(0xde1,1,0x88f0,g_framebuffer.w,g_framebuffer.h);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    fwrite("Loading {Scene-RGBA-Framebuffer-Texture}\n",0x29,1,_stdout);
    fflush(_stdout);
    (*glad_glActiveTexture)(0x84c1);
    (*glad_glBindTexture)(0xde1,g_gl.textures[1]);
    (*glad_glTexStorage2D)(0xde1,1,0x8814,g_framebuffer.w,g_framebuffer.h);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  }
  (*glad_glActiveTexture)(0x84c0);
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadSceneFramebufferTexture()
{
    if (glIsTexture(g_gl.textures[TEXTURE_SCENE]))
        glDeleteTextures(1, &g_gl.textures[TEXTURE_SCENE]);
    if (glIsTexture(g_gl.textures[TEXTURE_Z]))
        glDeleteTextures(1, &g_gl.textures[TEXTURE_Z]);
    glGenTextures(1, &g_gl.textures[TEXTURE_Z]);
    glGenTextures(1, &g_gl.textures[TEXTURE_SCENE]);

    switch (g_framebuffer.aa) {
        case AA_NONE:
            LOG("Loading {Scene-Z-Framebuffer-Texture}\n");
            glActiveTexture(GL_TEXTURE0 + TEXTURE_Z);
            glBindTexture(GL_TEXTURE_2D, g_gl.textures[TEXTURE_Z]);
            glTexStorage2D(GL_TEXTURE_2D,
                           1,
                           GL_DEPTH24_STENCIL8,
                           g_framebuffer.w,
                           g_framebuffer.h);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

            LOG("Loading {Scene-RGBA-Framebuffer-Texture}\n");
            glActiveTexture(GL_TEXTURE0 + TEXTURE_SCENE);
            glBindTexture(GL_TEXTURE_2D, g_gl.textures[TEXTURE_SCENE]);
            glTexStorage2D(GL_TEXTURE_2D,
                           1,
                           GL_RGBA32F,
                           g_framebuffer.w,
                           g_framebuffer.h);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            break;
        case AA_MSAA2:
        case AA_MSAA4:
        case AA_MSAA8:
        case AA_MSAA16: {
            int samples = 1 << g_framebuffer.aa;
            int maxSamples;

            glGetIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
            if (samples > maxSamples) {
                LOG("note: MSAA is %ix\n", maxSamples);
                samples = maxSamples;
            }
            LOG("Loading {Scene-MSAA-Z-Framebuffer-Texture}\n");
            glActiveTexture(GL_TEXTURE0 + TEXTURE_Z);
            glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, g_gl.textures[TEXTURE_Z]);
            glTexStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE,
                                      samples,
                                      GL_DEPTH24_STENCIL8,
                                      g_framebuffer.w,
                                      g_framebuffer.h,
                                      g_framebuffer.msaa.fixed);

            LOG("Loading {Scene-MSAA-RGBA-Framebuffer-Texture}\n");
            glActiveTexture(GL_TEXTURE0 + TEXTURE_SCENE);
            glBindTexture(GL_TEXTURE_2D_MULTISAMPLE,
                          g_gl.textures[TEXTURE_SCENE]);
            glTexStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE,
                                      samples,
                                      GL_RGBA32F,
                                      g_framebuffer.w,
                                      g_framebuffer.h,
                                      g_framebuffer.msaa.fixed);
        } break;
    }
    glActiveTexture(GL_TEXTURE0);

    return (glGetError() == GL_NO_ERROR);
}